

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  StrID SVar4;
  uint64_t uVar5;
  long lVar6;
  GCstr *pGVar7;
  ulong uVar8;
  bool bVar9;
  GCRef *pGVar10;
  uint8_t uVar11;
  StrHash h;
  int iVar12;
  GCstr *pGVar13;
  uint64_t uVar14;
  uint uVar15;
  GCstr *pGVar16;
  GCstr *pGVar17;
  MSize len;
  
  uVar5 = (L->glref).ptr64;
  if (lenx - 1 < 0x7ffffeff) {
    uVar14 = *(uint64_t *)(uVar5 + 0xb0);
    len = (MSize)lenx;
    h = hash_sparse(uVar14,str,len);
    lVar6 = *(long *)(uVar5 + 0x98);
    uVar3 = *(uint *)(uVar5 + 0xa0);
    pGVar7 = *(GCstr **)(lVar6 + (ulong)(h & uVar3) * 8);
    uVar15 = 0;
    if (((ulong)pGVar7 & 1) == 0) {
      uVar11 = '\0';
      pGVar16 = (GCstr *)(ulong)uVar3;
      pGVar17 = pGVar7;
      uVar15 = 0;
    }
    else {
      h = hash_dense(uVar14,h,str,len);
      pGVar16 = (GCstr *)(ulong)(uVar3 & h);
      uVar11 = '\x01';
      pGVar17 = (GCstr *)(*(ulong *)(lVar6 + (long)pGVar16 * 8) & 0xfffffffffffffffe);
    }
    do {
      pGVar13 = pGVar17;
      if (pGVar13 == (GCstr *)0x0) {
        if ((0x20 < uVar15) && (((ulong)pGVar7 & 1) == 0)) {
          pGVar13 = lj_str_rehash_chain(L,h,str,len);
          return pGVar13;
        }
        pGVar13 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,(ulong)(len & 0x7ffffffc) + 0x1c);
        uVar5 = (L->glref).ptr64;
        pGVar13->marked = *(byte *)(uVar5 + 0x20) & 3;
        pGVar13->gct = '\x04';
        pGVar13->len = len;
        pGVar13->hash = h;
        pcVar1 = (char *)(uVar5 + 0xac);
        cVar2 = *pcVar1;
        *pcVar1 = *pcVar1 + -1;
        if (cVar2 == '\0') {
          uVar14 = lj_prng_u64((PRNGState *)(uVar5 + 0x188));
          *(int *)(uVar5 + 0xa8) = (int)uVar14;
          *(char *)(uVar5 + 0xac) = (char)(uVar14 >> 0x38);
        }
        SVar4 = *(StrID *)(uVar5 + 0xa8);
        *(StrID *)(uVar5 + 0xa8) = SVar4 + 1;
        pGVar13->sid = SVar4;
        pGVar13->reserved = '\0';
        pGVar13->hashalg = uVar11;
        *(undefined4 *)((long)&pGVar13[1].nextgc.gcptr64 + (ulong)(len & 0x7ffffffc)) = 0;
        memcpy(pGVar13 + 1,str,lenx);
        uVar3 = *(uint *)(uVar5 + 0xa0);
        lVar6 = *(long *)(uVar5 + 0x98);
        uVar8 = *(ulong *)(lVar6 + (ulong)(h & uVar3) * 8);
        (pGVar13->nextgc).gcptr64 = uVar8 & 0xfffffffffffffffe;
        *(ulong *)(lVar6 + (ulong)(h & uVar3) * 8) = (ulong)((uint)uVar8 & 1) | (ulong)pGVar13;
        uVar15 = *(uint *)(uVar5 + 0xa4);
        *(uint *)(uVar5 + 0xa4) = uVar15 + 1;
        if (uVar15 <= uVar3) {
          return pGVar13;
        }
        lj_str_resize(L,uVar3 * 2 + 1);
        return pGVar13;
      }
      if ((pGVar13->hash == h) && (pGVar13->len == len)) {
        iVar12 = bcmp(str,pGVar13 + 1,lenx);
        if (iVar12 != 0) {
          uVar15 = uVar15 + 1;
          goto LAB_00124d65;
        }
        if ((~*(byte *)(uVar5 + 0x20) & pGVar13->marked & 3) != 0) {
          pGVar13->marked = pGVar13->marked ^ 3;
        }
        bVar9 = false;
        pGVar17 = pGVar13;
      }
      else {
LAB_00124d65:
        uVar15 = uVar15 + 1;
        pGVar10 = &pGVar13->nextgc;
        bVar9 = true;
        pGVar13 = pGVar16;
        pGVar17 = (GCstr *)pGVar10->gcptr64;
      }
      pGVar16 = pGVar13;
    } while (bVar9);
  }
  else {
    if (lenx != 0) {
      lj_err_msg(L,LJ_ERR_STROV);
    }
    pGVar13 = (GCstr *)(uVar5 + 0x78);
  }
  return pGVar13;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g = G(L);
  if (lenx-1 < LJ_MAX_STR-1) {
    MSize len = (MSize)lenx;
    StrHash hash = hash_sparse(g->str.seed, str, len);
    MSize coll = 0;
    int hashalg = 0;
    /* Check if the string has already been interned. */
    GCobj *o = gcref(g->str.tab[hash & g->str.mask]);
#if LUAJIT_SECURITY_STRHASH
    if (LJ_UNLIKELY((uintptr_t)o & 1)) {  /* Secondary hash for this chain? */
      hashalg = 1;
      hash = hash_dense(g->str.seed, hash, str, len);
      o = (GCobj *)(gcrefu(g->str.tab[hash & g->str.mask]) & ~(uintptr_t)1);
    }
#endif
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == hash && sx->len == len) {
	if (memcmp(str, strdata(sx), len) == 0) {
	  if (isdead(g, o)) flipwhite(o);  /* Resurrect if dead. */
	  return sx;  /* Return existing string. */
	}
	coll++;
      }
      coll++;
      o = gcnext(o);
    }
#if LUAJIT_SECURITY_STRHASH
    /* Rehash chain if there are too many collisions. */
    if (LJ_UNLIKELY(coll > LJ_STR_MAXCOLL) && !hashalg) {
      return lj_str_rehash_chain(L, hash, str, len);
    }
#endif
    /* Otherwise allocate a new string. */
    return lj_str_alloc(L, str, len, hash, hashalg);
  } else {
    if (lenx)
      lj_err_msg(L, LJ_ERR_STROV);
    return &g->strempty;
  }
}